

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

void __thiscall QSplitterHandle::moveSplitter(QSplitterHandle *this,int pos)

{
  long lVar1;
  QSplitter *this_00;
  bool bVar2;
  int index;
  QRect QVar3;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  bVar2 = QWidget::isRightToLeft(*(QWidget **)(lVar1 + 600));
  if ((bVar2) && (*(int *)(lVar1 + 0x260) == 1)) {
    QVar3 = QWidget::contentsRect(*(QWidget **)(lVar1 + 600));
    pos = (QVar3.x2.m_i.m_i - (QVar3.x1.m_i.m_i + pos)) + 1;
  }
  this_00 = *(QSplitter **)(lVar1 + 600);
  index = QSplitter::indexOf(this_00,&this->super_QWidget);
  QSplitter::moveSplitter(this_00,pos,index);
  return;
}

Assistant:

void QSplitterHandle::moveSplitter(int pos)
{
    Q_D(QSplitterHandle);
    if (d->s->isRightToLeft() && d->orient == Qt::Horizontal)
        pos = d->s->contentsRect().width() - pos;
    d->s->moveSplitter(pos, d->s->indexOf(this));
}